

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int ON_StringLengthUTF8(char *string,size_t string_capacity)

{
  char *end;
  char *string1;
  size_t string_capacity_local;
  char *string_local;
  
  end = string;
  if ((string != (char *)0x0) && (string_capacity != 0)) {
    for (; (end < string + string_capacity && (*end != '\0')); end = end + 1) {
    }
  }
  return (int)end - (int)string;
}

Assistant:

int ON_StringLengthUTF8(
  const char* string,
  size_t string_capacity
  )
{
  const char* string1 = string;
  if (nullptr != string1 && string_capacity > 0 )
  {
    for (const char* end = string1 + string_capacity; string1 < end; string1++)
    {
      if ( 0 == *string1)
        break;
    }
  }
  return (int)(string1 - string);
}